

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvhsah.hpp
# Opt level: O1

void __thiscall BVH::BVH(BVH *this,vector<Object_*,_std::allocator<Object_*>_> *list)

{
  pointer *pppVar1;
  pointer ppOVar2;
  iterator __position;
  undefined8 *puVar3;
  const_iterator __begin1;
  pointer ppOVar4;
  pair<Primitive_*,_Object_*> local_58;
  vector<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
  local_48;
  
  (this->super_Accelarator)._vptr_Accelarator = (_func_int **)&PTR_hit_0016b838;
  this->root = (treenode *)0x0;
  (this->list).
  super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).
  super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list).
  super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.first =
       (Primitive *)
       ((long)(list->super__Vector_base<Object_*,_std::allocator<Object_*>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(list->super__Vector_base<Object_*,_std::allocator<Object_*>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3);
  github111116::ConsoleLogger::log<char[20],unsigned_long,char[8]>
            (&console,(char (*) [20])"building SAH BVH of",(unsigned_long *)&local_58,
             (char (*) [8])"objects");
  ppOVar4 = (list->super__Vector_base<Object_*,_std::allocator<Object_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppOVar2 = (list->super__Vector_base<Object_*,_std::allocator<Object_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppOVar2 != ppOVar4) {
    do {
      local_58.second = *ppOVar4;
      local_58.first = (local_58.second)->primitive;
      __position._M_current =
           (this->list).
           super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->list).
          super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<Primitive*,Object*>,std::allocator<std::pair<Primitive*,Object*>>>::
        _M_realloc_insert<std::pair<Primitive*,Object*>>
                  ((vector<std::pair<Primitive*,Object*>,std::allocator<std::pair<Primitive*,Object*>>>
                    *)&this->list,__position,&local_58);
      }
      else {
        (__position._M_current)->first = local_58.first;
        (__position._M_current)->second = local_58.second;
        pppVar1 = &(this->list).
                   super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      ppOVar4 = ppOVar4 + 1;
    } while (ppOVar4 != ppOVar2);
    std::
    vector<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>::
    vector(&local_48,&this->list);
    build(this,&local_48,&this->root);
    if (local_48.
        super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "BVH: Object list empty!";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

BVH(const std::vector<Object*>& list) {
		console.log("building SAH BVH of", list.size(), "objects");
		if (list.size() == 0) throw "BVH: Object list empty!";
		for (Object* o: list) {
			this->list.push_back({o->primitive, o});
		}
		build(this->list, root);
		// printSA(root);
	}